

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O3

void ARGBLumaColorTableRow_C
               (uint8_t *src_argb,uint8_t *dst_argb,int width,uint8_t *luma,uint32_t lumacoeff)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  
  uVar3 = lumacoeff & 0xff;
  uVar1 = lumacoeff >> 8 & 0xff;
  uVar2 = lumacoeff >> 0x10 & 0xff;
  if (1 < width) {
    iVar4 = 0;
    do {
      uVar5 = src_argb[2] * uVar2 + src_argb[1] * uVar1 + uVar3 * *src_argb & 0x7f00;
      *dst_argb = luma[(ulong)*src_argb + (ulong)uVar5];
      dst_argb[1] = luma[(ulong)src_argb[1] + (ulong)uVar5];
      dst_argb[2] = luma[(ulong)src_argb[2] + (ulong)uVar5];
      dst_argb[3] = src_argb[3];
      uVar5 = src_argb[6] * uVar2 + src_argb[5] * uVar1 + src_argb[4] * uVar3 & 0x7f00;
      dst_argb[4] = luma[(ulong)src_argb[4] + (ulong)uVar5];
      dst_argb[5] = luma[(ulong)src_argb[5] + (ulong)uVar5];
      dst_argb[6] = luma[(ulong)src_argb[6] + (ulong)uVar5];
      dst_argb[7] = src_argb[7];
      src_argb = src_argb + 8;
      dst_argb = dst_argb + 8;
      iVar4 = iVar4 + 2;
    } while (iVar4 < width + -1);
  }
  if ((width & 1U) != 0) {
    uVar1 = uVar2 * src_argb[2] + uVar1 * src_argb[1] + uVar3 * *src_argb & 0x7f00;
    *dst_argb = luma[(ulong)*src_argb + (ulong)uVar1];
    dst_argb[1] = luma[(ulong)src_argb[1] + (ulong)uVar1];
    dst_argb[2] = luma[(ulong)src_argb[2] + (ulong)uVar1];
    dst_argb[3] = src_argb[3];
  }
  return;
}

Assistant:

void ARGBLumaColorTableRow_C(const uint8_t* src_argb,
                             uint8_t* dst_argb,
                             int width,
                             const uint8_t* luma,
                             uint32_t lumacoeff) {
  uint32_t bc = lumacoeff & 0xff;
  uint32_t gc = (lumacoeff >> 8) & 0xff;
  uint32_t rc = (lumacoeff >> 16) & 0xff;

  int i;
  for (i = 0; i < width - 1; i += 2) {
    // Luminance in rows, color values in columns.
    const uint8_t* luma0 =
        ((src_argb[0] * bc + src_argb[1] * gc + src_argb[2] * rc) & 0x7F00u) +
        luma;
    const uint8_t* luma1;
    dst_argb[0] = luma0[src_argb[0]];
    dst_argb[1] = luma0[src_argb[1]];
    dst_argb[2] = luma0[src_argb[2]];
    dst_argb[3] = src_argb[3];
    luma1 =
        ((src_argb[4] * bc + src_argb[5] * gc + src_argb[6] * rc) & 0x7F00u) +
        luma;
    dst_argb[4] = luma1[src_argb[4]];
    dst_argb[5] = luma1[src_argb[5]];
    dst_argb[6] = luma1[src_argb[6]];
    dst_argb[7] = src_argb[7];
    src_argb += 8;
    dst_argb += 8;
  }
  if (width & 1) {
    // Luminance in rows, color values in columns.
    const uint8_t* luma0 =
        ((src_argb[0] * bc + src_argb[1] * gc + src_argb[2] * rc) & 0x7F00u) +
        luma;
    dst_argb[0] = luma0[src_argb[0]];
    dst_argb[1] = luma0[src_argb[1]];
    dst_argb[2] = luma0[src_argb[2]];
    dst_argb[3] = src_argb[3];
  }
}